

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# advertise_service_options.h
# Opt level: O0

void __thiscall
miniros::AdvertiseServiceOptions::init<roscpp::GetLoggers>
          (AdvertiseServiceOptions *this,string *_service,
          function<bool_(roscpp::GetLoggersRequest_<std::allocator<void>_>_&,_roscpp::GetLoggersResponse_<std::allocator<void>_>_&)>
          *_callback)

{
  char *pcVar1;
  string *in_RSI;
  function<bool_(roscpp::GetLoggersRequest_<std::allocator<void>_>_&,_roscpp::GetLoggersResponse_<std::allocator<void>_>_&)>
  *in_RDI;
  shared_ptr<miniros::ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>_>,_roscpp::GetLoggersResponse_<std::allocator<void>_>_>_>_>
  *in_stack_ffffffffffffffc8;
  function<bool_(roscpp::GetLoggersRequest_<std::allocator<void>_>_&,_roscpp::GetLoggersResponse_<std::allocator<void>_>_&)>
  *__args;
  
  __args = in_RDI;
  std::__cxx11::string::operator=((string *)in_RDI,in_RSI);
  pcVar1 = service_traits::md5sum<roscpp::GetLoggers>();
  std::__cxx11::string::operator=((string *)(in_RDI + 1),pcVar1);
  pcVar1 = service_traits::datatype<roscpp::GetLoggers>();
  std::__cxx11::string::operator=((string *)(in_RDI + 2),pcVar1);
  pcVar1 = message_traits::datatype<roscpp::GetLoggersRequest_<std::allocator<void>>>();
  std::__cxx11::string::operator=((string *)(in_RDI + 3),pcVar1);
  pcVar1 = message_traits::datatype<roscpp::GetLoggersResponse_<std::allocator<void>>>();
  std::__cxx11::string::operator=((string *)(in_RDI + 4),pcVar1);
  std::
  make_shared<miniros::ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>>,roscpp::GetLoggersResponse_<std::allocator<void>>>>,std::function<bool(roscpp::GetLoggersRequest_<std::allocator<void>>&,roscpp::GetLoggersResponse_<std::allocator<void>>&)>const&>
            (__args);
  std::shared_ptr<miniros::ServiceCallbackHelper>::operator=
            ((shared_ptr<miniros::ServiceCallbackHelper> *)in_RDI,in_stack_ffffffffffffffc8);
  std::
  shared_ptr<miniros::ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>_>,_roscpp::GetLoggersResponse_<std::allocator<void>_>_>_>_>
  ::~shared_ptr((shared_ptr<miniros::ServiceCallbackHelperT<miniros::ServiceSpec<roscpp::GetLoggersRequest_<std::allocator<void>_>,_roscpp::GetLoggersResponse_<std::allocator<void>_>_>_>_>
                 *)0x440011);
  return;
}

Assistant:

void init(const std::string& _service, const std::function<bool(typename Service::Request&, typename Service::Response&)>& _callback)
  {
    namespace st = service_traits;
    namespace mt = message_traits;
    typedef typename Service::Request Request;
    typedef typename Service::Response Response;
    service = _service;
    md5sum = st::md5sum<Service>();
    datatype = st::datatype<Service>();
    req_datatype = mt::datatype<Request>();
    res_datatype = mt::datatype<Response>();
    helper = std::make_shared<ServiceCallbackHelperT<ServiceSpec<Request, Response> > >(_callback);
  }